

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

Abc_Cex_t * Gia_ManBmcCexGen(Bmc_Mna_t *pMan,Gia_Man_t *p,int iOut)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Gia_Man_t *pGVar5;
  Abc_Cex_t *pAVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  
  iVar7 = p->nRegs;
  pAVar6 = Abc_CexAlloc(iVar7,p->vCis->nSize - iVar7,iOut / (p->vCos->nSize - iVar7) + 1);
  iVar7 = p->vCos->nSize - p->nRegs;
  pAVar6->iFrame = iOut / iVar7;
  pAVar6->iPo = iOut % iVar7;
  pVVar3 = pMan->vPiMap;
  iVar7 = pVVar3->nSize;
  if (iVar7 < 1) {
    uVar9 = 0;
  }
  else {
    piVar4 = pVVar3->pArray;
    lVar10 = 0;
    uVar8 = 0xffffffff;
    uVar9 = 0;
    do {
      uVar1 = piVar4[lVar10];
      if ((int)uVar1 < 0) {
        uVar8 = ~uVar1;
      }
      else {
        pGVar5 = pMan->pFrames;
        iVar2 = pGVar5->vCis->nSize;
        if (iVar2 - pGVar5->nRegs <= (int)uVar9) {
          __assert_fail("v < Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
        }
        if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) {
LAB_00575613:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pGVar5->vCis->pArray[uVar9];
        if (((long)iVar2 < 0) || (pGVar5->nObjs <= iVar2)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pMan->vId2Var->nSize <= iVar2) goto LAB_00575613;
        iVar2 = pMan->vId2Var->pArray[iVar2];
        if (((long)iVar2 < 0) || (pMan->pSat->size <= iVar2)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (pMan->pSat->model[iVar2] == 1) {
          iVar7 = uVar1 + p->nRegs + (p->vCis->nSize - p->nRegs) * uVar8;
          (&pAVar6[1].iPo)[iVar7 >> 5] = (&pAVar6[1].iPo)[iVar7 >> 5] | 1 << ((byte)iVar7 & 0x1f);
          iVar7 = pVVar3->nSize;
        }
        uVar9 = uVar9 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar7);
  }
  if (uVar9 != pMan->pFrames->vCis->nSize - pMan->pFrames->nRegs) {
    __assert_fail("iFramePi == Gia_ManPiNum(pMan->pFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcAnd.c"
                  ,0x2f6,"Abc_Cex_t *Gia_ManBmcCexGen(Bmc_Mna_t *, Gia_Man_t *, int)");
  }
  return pAVar6;
}

Assistant:

Abc_Cex_t * Gia_ManBmcCexGen( Bmc_Mna_t * pMan, Gia_Man_t * p, int iOut )
{
    Abc_Cex_t * pCex;
    int i, iObjId, iSatVar, iOrigPi;
    int iFramePi = 0, iFrame = -1;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p), Gia_ManPiNum(p), iOut / Gia_ManPoNum(p) + 1 );
    pCex->iFrame = iOut / Gia_ManPoNum(p);
    pCex->iPo = iOut % Gia_ManPoNum(p);
    // fill in the input values
    Vec_IntForEachEntry( pMan->vPiMap, iOrigPi, i )
    {
        if ( iOrigPi < 0 )
        {
            iFrame = -iOrigPi-1;
            continue;
        }
        // iOrigPi in iFrame of pGia has PI index iFramePi in pMan->pFrames,
        iObjId = Gia_ObjId( pMan->pFrames, Gia_ManPi(pMan->pFrames, iFramePi) );
        iSatVar = Vec_IntEntry( pMan->vId2Var, iObjId );
        if ( sat_solver_var_value(pMan->pSat, iSatVar) )
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p) + Gia_ManPiNum(p) * iFrame + iOrigPi );
        iFramePi++;
    }
    assert( iFramePi == Gia_ManPiNum(pMan->pFrames) );
    return pCex;
}